

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_rebuild_sorted_global(REF_NODE ref_node)

{
  int iVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_INT *pRVar4;
  REF_GLOB *pRVar5;
  uint uVar6;
  void *__ptr;
  long lVar7;
  int iVar8;
  
  iVar1 = ref_node->n;
  if ((long)iVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1f6,
           "ref_node_rebuild_sorted_global","malloc pack of REF_INT negative");
    uVar6 = 1;
  }
  else {
    __ptr = malloc((long)iVar1 * 4);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1f6,
             "ref_node_rebuild_sorted_global","malloc pack of REF_INT NULL");
      uVar6 = 2;
    }
    else {
      iVar2 = ref_node->max;
      if (0 < (long)iVar2) {
        pRVar3 = ref_node->global;
        lVar7 = 0;
        iVar8 = 0;
        do {
          if (-1 < pRVar3[lVar7]) {
            ref_node->sorted_global[iVar8] = pRVar3[lVar7];
            *(int *)((long)__ptr + (long)iVar8 * 4) = (int)lVar7;
            iVar8 = iVar8 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (iVar2 != lVar7);
      }
      uVar6 = ref_sort_heap_glob(iVar1,ref_node->sorted_global,ref_node->sorted_local);
      if (uVar6 == 0) {
        if (0 < ref_node->n) {
          pRVar4 = ref_node->sorted_local;
          pRVar3 = ref_node->global;
          pRVar5 = ref_node->sorted_global;
          lVar7 = 0;
          do {
            iVar1 = *(int *)((long)__ptr + (long)pRVar4[lVar7] * 4);
            pRVar4[lVar7] = iVar1;
            pRVar5[lVar7] = pRVar3[iVar1];
            lVar7 = lVar7 + 1;
          } while (lVar7 < ref_node->n);
        }
        free(__ptr);
        uVar6 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x201,"ref_node_rebuild_sorted_global",(ulong)uVar6,"heap");
      }
    }
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_rebuild_sorted_global(REF_NODE ref_node) {
  REF_INT node, nnode, *pack;

  ref_malloc(pack, ref_node_n(ref_node), REF_INT);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    ref_node->sorted_global[nnode] = ref_node->global[node];
    pack[nnode] = node;
    nnode++;
  }

  RSS(ref_sort_heap_glob(ref_node_n(ref_node), ref_node->sorted_global,
                         ref_node->sorted_local),
      "heap");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    ref_node->sorted_local[node] = pack[ref_node->sorted_local[node]];
    ref_node->sorted_global[node] =
        ref_node->global[ref_node->sorted_local[node]];
  }

  ref_free(pack);
  return REF_SUCCESS;
}